

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

char * quicly_hexdump(uint8_t *bytes,size_t len,size_t indent)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  char cVar10;
  uint8_t *puVar11;
  char cVar12;
  uint8_t uVar13;
  size_t sVar14;
  ulong uVar15;
  bool bVar16;
  
  if (indent == 0xffffffffffffffff) {
    lVar5 = len * 2;
  }
  else {
    lVar5 = (len + 0xf >> 4) * (indent + 0x48);
  }
  pcVar2 = (char *)malloc((size_t)(lVar5 + 1));
  if (pcVar2 != (char *)0x0) {
    pcVar3 = pcVar2;
    if (indent == 0xffffffffffffffff) {
      for (sVar14 = 0; len != sVar14; sVar14 = sVar14 + 1) {
        bVar1 = bytes[sVar14];
        *pcVar3 = "0123456789abcdef"[bVar1 >> 4];
        pcVar3[1] = "0123456789abcdef"[bVar1 & 0xf];
        pcVar3 = pcVar3 + 2;
      }
    }
    else {
      uVar4 = 0;
      puVar11 = bytes;
      for (uVar15 = 0; uVar15 << 4 < len; uVar15 = uVar15 + 1) {
        pcVar6 = pcVar3 + 5;
        pcVar9 = pcVar3 + 7;
        pcVar3 = pcVar3 + 8;
        sVar14 = indent;
        while (bVar16 = sVar14 != 0, sVar14 = sVar14 - 1, bVar16) {
          pcVar6[-5] = ' ';
          pcVar6 = pcVar6 + 1;
          pcVar9 = pcVar9 + 1;
          pcVar3 = pcVar3 + 1;
        }
        pcVar6[-5] = "0123456789abcdef"[(uint)(uVar15 >> 8) & 0xf];
        pcVar6[-4] = "0123456789abcdef"[(uint)(uVar15 >> 4) & 0xf];
        pcVar6[-3] = "0123456789abcdef"[(uint)uVar15 & 0xf];
        pcVar6[-2] = '0';
        pcVar6[-1] = ' ';
        for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
          cVar12 = ' ';
          if (lVar7 == 8) {
            cVar12 = '-';
          }
          pcVar9[-2] = cVar12;
          cVar12 = ' ';
          cVar10 = ' ';
          if (uVar4 + lVar7 < len) {
            cVar12 = "0123456789abcdef"[puVar11[lVar7] >> 4];
            cVar10 = "0123456789abcdef"[puVar11[lVar7] & 0xf];
          }
          pcVar9[-1] = cVar12;
          *pcVar9 = cVar10;
          pcVar9 = pcVar9 + 3;
          pcVar3 = pcVar3 + 3;
        }
        pcVar9[-2] = ' ';
        pcVar9[-1] = ' ';
        lVar7 = 0x10;
        uVar8 = uVar4;
        while (bVar16 = lVar7 != 0, lVar7 = lVar7 + -1, bVar16) {
          uVar13 = ' ';
          if ((uVar8 < len) && (uVar13 = bytes[uVar8], 0x5e < (byte)(uVar13 - 0x20))) {
            uVar13 = '.';
          }
          pcVar3[-1] = uVar13;
          uVar8 = uVar8 + 1;
          pcVar3 = pcVar3 + 1;
        }
        pcVar3[-1] = '\n';
        uVar4 = uVar4 + 0x10;
        puVar11 = puVar11 + 0x10;
      }
    }
    *pcVar3 = '\0';
    if ((char *)(lVar5 + 1) < pcVar3 + (1 - (long)pcVar2)) {
      __assert_fail("p - buf <= bufsize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x17a6,"char *quicly_hexdump(const uint8_t *, size_t, size_t)");
    }
  }
  return pcVar2;
}

Assistant:

char *quicly_hexdump(const uint8_t *bytes, size_t len, size_t indent)
{
    size_t i, line, row, bufsize = indent == SIZE_MAX ? len * 2 + 1 : (indent + 5 + 3 * 16 + 2 + 16 + 1) * ((len + 15) / 16) + 1;
    char *buf, *p;

    if ((buf = malloc(bufsize)) == NULL)
        return NULL;
    p = buf;
    if (indent == SIZE_MAX) {
        for (i = 0; i != len; ++i) {
            quicly_byte_to_hex(p, bytes[i]);
            p += 2;
        }
    } else {
        for (line = 0; line * 16 < len; ++line) {
            for (i = 0; i < indent; ++i)
                *p++ = ' ';
            quicly_byte_to_hex(p, (line >> 4) & 0xff);
            p += 2;
            quicly_byte_to_hex(p, (line << 4) & 0xff);
            p += 2;
            *p++ = ' ';
            for (row = 0; row < 16; ++row) {
                *p++ = row == 8 ? '-' : ' ';
                if (line * 16 + row < len) {
                    quicly_byte_to_hex(p, bytes[line * 16 + row]);
                    p += 2;
                } else {
                    *p++ = ' ';
                    *p++ = ' ';
                }
            }
            *p++ = ' ';
            *p++ = ' ';
            for (row = 0; row < 16; ++row) {
                if (line * 16 + row < len) {
                    int ch = bytes[line * 16 + row];
                    *p++ = 0x20 <= ch && ch < 0x7f ? ch : '.';
                } else {
                    *p++ = ' ';
                }
            }
            *p++ = '\n';
        }
    }
    *p++ = '\0';

    assert(p - buf <= bufsize);

    return buf;
}